

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O1

int __thiscall TextFile::close(TextFile *this,int __fd)

{
  int in_EAX;
  
  if ((this->fromMemory == false) &&
     (in_EAX = std::__basic_file<char>::is_open(), (char)in_EAX != '\0')) {
    std::ostream::write(&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.
                         field_0x10,(long)(this->buf)._M_dataplus._M_p);
    this->bufPos = 0;
    in_EAX = std::fstream::close();
  }
  this->bufPos = 0;
  return in_EAX;
}

Assistant:

void TextFile::close()
{
	if (isOpen() && !fromMemory)
	{
		bufDrainWrite();
		stream.close();
	}
	bufPos = 0;
}